

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_clear_bit(BIGNUM *a,int n)

{
  int iVar1;
  int j;
  int i;
  int local_4;
  
  if (n < 0) {
    local_4 = 0;
  }
  else {
    iVar1 = n / 0x40;
    if (iVar1 < a->top) {
      a->d[iVar1] = (1L << ((byte)(n % 0x40) & 0x3f) ^ 0xffffffffffffffffU) & a->d[iVar1];
      bn_correct_top((BIGNUM *)a);
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int BN_clear_bit(BIGNUM *a, int n)
{
    int i, j;

    bn_check_top(a);
    if (n < 0)
        return 0;

    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i)
        return (0);

    a->d[i] &= (~(((BN_ULONG)1) << j));
    bn_correct_top(a);
    return (1);
}